

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cali.cpp
# Opt level: O0

int cali_channel_is_active(cali_id_t chn_id)

{
  bool bVar1;
  ostream *poVar2;
  void *this;
  Log local_260;
  Caliper local_48;
  undefined1 local_28 [8];
  Channel channel;
  cali_id_t chn_id_local;
  
  channel.mP.super___shared_ptr<cali::ChannelBody,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)chn_id;
  cali::Caliper::instance();
  cali::Caliper::get_channel((Caliper *)local_28,(cali_id_t)&local_48);
  cali::Caliper::~Caliper(&local_48);
  bVar1 = cali::Channel::operator_cast_to_bool((Channel *)local_28);
  if (bVar1) {
    bVar1 = cali::Channel::is_active((Channel *)local_28);
    chn_id_local._4_4_ = (uint)bVar1;
  }
  else {
    cali::Log::Log(&local_260,0);
    poVar2 = cali::Log::stream(&local_260);
    poVar2 = std::operator<<(poVar2,"cali_channel_is_active(): invalid channel id ");
    this = (void *)std::ostream::operator<<
                             (poVar2,(ulong)channel.mP.
                                            super___shared_ptr<cali::ChannelBody,_(__gnu_cxx::_Lock_policy)2>
                                            ._M_refcount._M_pi);
    std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
    cali::Log::~Log(&local_260);
    chn_id_local._4_4_ = 0;
  }
  cali::Channel::~Channel((Channel *)local_28);
  return chn_id_local._4_4_;
}

Assistant:

int cali_channel_is_active(cali_id_t chn_id)
{
    Channel channel = Caliper::instance().get_channel(chn_id);

    if (!channel) {
        Log(0).stream() << "cali_channel_is_active(): invalid channel id " << chn_id << std::endl;
        return 0;
    }

    return (channel.is_active() ? 1 : 0);
}